

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> * __thiscall
ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>::operator<<
          (ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *obj)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  WriteCompactSize<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>>
            ((ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *
             )this,(ulong)uVar3);
  uVar1 = obj->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  if (uVar3 != 0) {
    if (0x10 < uVar1) {
      obj = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            (obj->_union).indirect_contents.indirect;
    }
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              (*(vector<std::byte,zero_after_free_allocator<std::byte>> **)(*(long *)(this + 8) + 8)
               ,*(undefined8 *)
                 (*(vector<std::byte,zero_after_free_allocator<std::byte>> **)
                   (*(long *)(this + 8) + 8) + 8),obj,(long)&obj->_union + (ulong)uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *)
           this;
  }
  __stack_chk_fail();
}

Assistant:

ParamsStream& operator>>(U&& obj) { ::Unserialize(*this, obj); return *this; }